

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

int lookup_uniforms(MOJOSHADER_glProgram *program,MOJOSHADER_glShader *shader,int *bound)

{
  MOJOSHADER_uniform *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MOJOSHADER_uniformType MVar5;
  MOJOSHADER_parseData *pMVar6;
  _func_int *p_Var7;
  _func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *p_Var8;
  UniformMap *pUVar9;
  _func_void_MOJOSHADER_glProgram_ptr *p_Var10;
  _func_void_MOJOSHADER_glProgram_ptr_MOJOSHADER_uniform_ptr_GLfloat_ptr *p_Var11;
  MOJOSHADER_sampler *pMVar12;
  void *pvVar13;
  MOJOSHADER_malloc p_Var14;
  undefined8 uVar15;
  MOJOSHADER_glShader *pMVar16;
  int iVar17;
  GLint GVar18;
  GLfloat *__s;
  GLint *pGVar19;
  GLfloat **ppGVar20;
  GLint **ppGVar21;
  size_t *psVar22;
  uint uVar23;
  anon_union_16_3_4e909c65_for_value *paVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  size_t sVar28;
  MOJOSHADER_glShader **ppMVar29;
  MOJOSHADER_glShader *local_58;
  int *local_50;
  ulong local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  ppMVar29 = &local_58;
  pMVar6 = shader->parseData;
  local_48 = (ulong)pMVar6->shader_type;
  local_58 = shader;
  local_50 = bound;
  if (pMVar6->uniform_count < 1) {
    local_38 = 0;
    local_3c = 0;
    local_34 = 0;
    ppMVar29 = &local_58;
  }
  else {
    lVar27 = 0;
    local_34 = 0;
    local_3c = 0;
    local_38 = 0;
    do {
      pMVar16 = local_58;
      pMVar1 = pMVar6->uniforms + lVar27;
      if (pMVar1->constant == 0) {
        p_Var8 = ctx->profileGetUniformLocation;
        *(undefined8 *)((long)ppMVar29 + -8) = 0x10addb;
        GVar18 = (*p_Var8)(program,pMVar16,(int)lVar27);
        if (GVar18 != -1) {
          iVar17 = pMVar1->array_count;
          pUVar9 = program->uniforms;
          uVar23 = program->uniform_count;
          pUVar9[uVar23].shader_type = (MOJOSHADER_shaderType)local_48;
          pUVar9[uVar23].uniform = pMVar1;
          pUVar9[uVar23].location = GVar18;
          program->uniform_count = uVar23 + 1;
          MVar5 = pMVar1->type;
          if (MVar5 == MOJOSHADER_UNIFORM_BOOL) {
            local_38 = local_38 + iVar17 + (uint)(iVar17 == 0);
          }
          else if (MVar5 == MOJOSHADER_UNIFORM_INT) {
            local_3c = local_3c + iVar17 + (uint)(iVar17 == 0);
          }
          else {
            if (MVar5 != MOJOSHADER_UNIFORM_FLOAT) {
              *(undefined8 *)((long)ppMVar29 + -8) = 0x10b09d;
              __assert_fail("0 && \"Unexpected register type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x6a7,
                            "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                           );
            }
            local_34 = local_34 + iVar17 + (uint)(iVar17 == 0);
          }
        }
      }
      else {
        p_Var7 = ctx->profileMustPushConstantArrays;
        *(undefined8 *)((long)ppMVar29 + -8) = 0x10ad56;
        iVar17 = (*p_Var7)();
        if (iVar17 != 0) {
          iVar17 = pMVar1->array_count;
          ppMVar29 = (MOJOSHADER_glShader **)((long)ppMVar29 + (long)iVar17 * -0x10);
          iVar2 = pMVar6->constant_count;
          if ((long)iVar2 < 1) {
            iVar25 = 0;
          }
          else {
            iVar3 = pMVar1->index;
            paVar24 = &pMVar6->constants->value;
            uVar26 = 0;
            iVar25 = 0;
            do {
              if (((MOJOSHADER_constant *)((long)paVar24 + -8))->type == MOJOSHADER_UNIFORM_FLOAT) {
                iVar4 = *(int *)((long)paVar24 + -4);
                if ((iVar3 <= iVar4) && (iVar4 < iVar17 + iVar3)) {
                  uVar15 = *(undefined8 *)((long)paVar24 + 8);
                  *(undefined8 *)((long)ppMVar29 + (long)((iVar4 - iVar3) * 4) * 4) =
                       *(undefined8 *)paVar24;
                  *(undefined8 *)((GLfloat *)((long)ppMVar29 + (long)((iVar4 - iVar3) * 4) * 4) + 2)
                       = uVar15;
                  iVar25 = iVar25 + 1;
                }
              }
              uVar26 = uVar26 + 1;
              paVar24 = (anon_union_16_3_4e909c65_for_value *)((long)paVar24 + 0x18);
            } while (uVar26 < (ulong)(long)iVar2);
          }
          if (iVar25 != iVar17) {
            *(GLfloat *)((long)ppMVar29 + -8) = 1.532681e-39;
            *(GLfloat *)((long)ppMVar29 + -4) = 0.0;
            __assert_fail("filled == size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x670,
                          "void fill_constant_array(GLfloat *, const int, const int, const MOJOSHADER_parseData *)"
                         );
          }
          if (*local_50 == 0) {
            p_Var10 = ctx->profileUseProgram;
            *(GLfloat *)((long)ppMVar29 + -8) = 1.531895e-39;
            *(GLfloat *)((long)ppMVar29 + -4) = 0.0;
            (*p_Var10)(program);
            *local_50 = 1;
          }
          p_Var11 = ctx->profilePushConstantArray;
          *(GLfloat *)((long)ppMVar29 + -8) = 1.53194e-39;
          *(GLfloat *)((long)ppMVar29 + -4) = 0.0;
          (*p_Var11)(program,pMVar1,(GLfloat *)ppMVar29);
        }
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < pMVar6->uniform_count);
  }
  iVar17 = (int)local_48;
  uVar23 = local_34;
  if ((iVar17 == 1) && (iVar2 = pMVar6->sampler_count, 0 < (long)iVar2)) {
    pMVar12 = pMVar6->samplers;
    lVar27 = 0;
    do {
      if (*(int *)((long)&pMVar12->texbem + lVar27) != 0) {
        uVar23 = uVar23 + 2;
        program->texbem_count = program->texbem_count + 1;
      }
      lVar27 = lVar27 + 0x18;
    } while ((long)iVar2 * 0x18 != lVar27);
  }
  if (uVar23 != 0) {
    sVar28 = (ulong)uVar23 << 4;
    pvVar13 = ctx->malloc_data;
    p_Var14 = ctx->malloc_fn;
    *(undefined8 *)((long)ppMVar29 + -8) = 0x10af01;
    __s = (GLfloat *)(*p_Var14)((int)sVar28,pvVar13);
    if (__s == (GLfloat *)0x0) {
      builtin_strncpy(error_buffer,"out of memory",0xe);
      return 0;
    }
    if (1 < iVar17 - 1U) {
      *(undefined8 *)((long)ppMVar29 + -8) = 0x10b0bc;
      __assert_fail("0 && \"unsupported shader type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x6ca,
                    "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
    }
    ppGVar20 = &program->ps_uniforms_float4;
    if (iVar17 == 2) {
      ppGVar20 = &program->vs_uniforms_float4;
    }
    *ppGVar20 = __s;
    psVar22 = &program->vs_uniforms_float4_count;
    if (iVar17 != 2) {
      psVar22 = &program->ps_uniforms_float4_count;
    }
    *psVar22 = (ulong)uVar23;
    *(undefined8 *)((long)ppMVar29 + -8) = 0x10af47;
    memset(__s,0,sVar28);
  }
  if (local_3c != 0) {
    uVar26 = (ulong)local_3c;
    sVar28 = uVar26 << 4;
    pvVar13 = ctx->malloc_data;
    p_Var14 = ctx->malloc_fn;
    *(undefined8 *)((long)ppMVar29 + -8) = 0x10af68;
    pGVar19 = (GLint *)(*p_Var14)((int)sVar28,pvVar13);
    if (pGVar19 == (GLint *)0x0) {
      builtin_strncpy(error_buffer,"out of memory",0xe);
      return 0;
    }
    if (1 < iVar17 - 1U) {
      *(undefined8 *)((long)ppMVar29 + -8) = 0x10b0db;
      __assert_fail("0 && \"unsupported shader type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x6cb,
                    "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
    }
    ppGVar21 = &program->ps_uniforms_int4;
    if (iVar17 == 2) {
      ppGVar21 = &program->vs_uniforms_int4;
    }
    *ppGVar21 = pGVar19;
    psVar22 = &program->vs_uniforms_int4_count;
    if (iVar17 != 2) {
      psVar22 = &program->ps_uniforms_int4_count;
    }
    *psVar22 = uVar26;
    *(undefined8 *)((long)ppMVar29 + -8) = 0x10afb1;
    memset(pGVar19,0,sVar28);
  }
  if (local_38 == 0) {
    return 1;
  }
  uVar26 = (ulong)local_38;
  sVar28 = uVar26 * 4;
  pvVar13 = ctx->malloc_data;
  p_Var14 = ctx->malloc_fn;
  *(undefined8 *)((long)ppMVar29 + -8) = 0x10afdd;
  pGVar19 = (GLint *)(*p_Var14)((int)sVar28,pvVar13);
  if (pGVar19 == (GLint *)0x0) {
    builtin_strncpy(error_buffer,"out of memory",0xe);
    return 0;
  }
  iVar17 = (int)local_48;
  if (1 < iVar17 - 1U) {
    *(code **)((long)ppMVar29 + -8) = lookup_samplers;
    __assert_fail("0 && \"unsupported shader type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x6cc,"int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                 );
  }
  ppGVar21 = &program->ps_uniforms_bool;
  if (iVar17 == 2) {
    ppGVar21 = &program->vs_uniforms_bool;
  }
  *ppGVar21 = pGVar19;
  psVar22 = &program->vs_uniforms_bool_count;
  if (iVar17 != 2) {
    psVar22 = &program->ps_uniforms_bool_count;
  }
  *psVar22 = uVar26;
  *(undefined8 *)((long)ppMVar29 + -8) = 0x10b026;
  memset(pGVar19,0,sVar28);
  return 1;
}

Assistant:

static int lookup_uniforms(MOJOSHADER_glProgram *program,
                           MOJOSHADER_glShader *shader, int *bound)
{
    const MOJOSHADER_parseData *pd = shader->parseData;
    const MOJOSHADER_shaderType shader_type = pd->shader_type;
    uint32 float4_count = 0;
    uint32 int4_count = 0;
    uint32 bool_count = 0;
    int i;

    for (i = 0; i < pd->uniform_count; i++)
    {
        const MOJOSHADER_uniform *u = &pd->uniforms[i];

        if (u->constant)
        {
            // only do constants once, at link time. These aren't changed ever.
            if (ctx->profileMustPushConstantArrays())
            {
                const int base = u->index;
                const int size = u->array_count;
                GLfloat *f = (GLfloat *) alloca(sizeof (GLfloat) * (size * 4));
                fill_constant_array(f, base, size, pd);
                if (!(*bound))
                {
                    ctx->profileUseProgram(program);
                    *bound = 1;
                } // if
                ctx->profilePushConstantArray(program, u, f);
            } // if
        } // if

        else
        {
            const GLint loc = ctx->profileGetUniformLocation(program, shader, i);
            if (loc != -1)  // -1 means it was optimized out, or failure.
            {
                const int regcount = u->array_count;
                UniformMap *map = &program->uniforms[program->uniform_count];
                map->shader_type = shader_type;
                map->uniform = u;
                map->location = (GLuint) loc;
                program->uniform_count++;

                if (u->type == MOJOSHADER_UNIFORM_FLOAT)
                    float4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_INT)
                    int4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_BOOL)
                    bool_count += regcount ? regcount : 1;
                else
                    assert(0 && "Unexpected register type");
            } // if
        } // else
    } // for

    if (shader_type == MOJOSHADER_TYPE_PIXEL)
    {
        for (i = 0; i < pd->sampler_count; i++)
        {
            if (pd->samplers[i].texbem)
            {
                float4_count += 2;
                program->texbem_count++;
            } // if
        } // for
    } // if

    #define MAKE_ARRAY(typ, gltyp, siz, count) \
        if (count) { \
            const size_t buflen = sizeof (gltyp) * siz * count; \
            gltyp *ptr = (gltyp *) Malloc(buflen); \
            if (ptr == NULL) { \
                return 0; \
            } else if (shader_type == MOJOSHADER_TYPE_VERTEX) { \
                program->vs_uniforms_##typ = ptr; \
                program->vs_uniforms_##typ##_count = count; \
            } else if (shader_type == MOJOSHADER_TYPE_PIXEL) { \
                program->ps_uniforms_##typ = ptr; \
                program->ps_uniforms_##typ##_count = count; \
            } else { \
                assert(0 && "unsupported shader type"); \
            } \
            memset(ptr, '\0', buflen); \
        }

    MAKE_ARRAY(float4, GLfloat, 4, float4_count);
    MAKE_ARRAY(int4, GLint, 4, int4_count);
    MAKE_ARRAY(bool, GLint, 1, bool_count);

    #undef MAKE_ARRAY

    return 1;
}